

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree_kv_test.cc
# Opt level: O0

void kv_cmp_key_str_test(btree_kv_ops *kv_ops,int i)

{
  char *__s;
  btree_cmp_func *pbVar1;
  void *pvVar2;
  void *pvVar3;
  ulong uVar4;
  undefined1 *puVar5;
  undefined1 local_b8 [8];
  btree_kv_ops *in_stack_ffffffffffffff50;
  btree_kv_ops *local_90;
  btree_kv_ops *kv_ops2;
  void *tmp;
  char **keys;
  int local_70;
  int n;
  int cmp;
  idx_t idx;
  timeval __test_interval_ins;
  timeval __test_interval_total;
  timeval __test_cur;
  timeval __test_prev;
  timeval __test_begin;
  int i_local;
  btree_kv_ops *kv_ops_local;
  
  gettimeofday((timeval *)&__test_prev.tv_usec,(__timezone_ptr_t)0x0);
  memleak_start();
  keys._4_4_ = 4;
  tmp = local_b8;
  local_90 = (btree_kv_ops *)0x0;
  if (i == 0) {
    local_90 = btree_kv_get_kb64_vb64(in_stack_ffffffffffffff50);
  }
  if (i == 1) {
    local_90 = btree_kv_get_kb32_vb64(in_stack_ffffffffffffff50);
  }
  kv_ops2 = (btree_kv_ops *)0x0;
  puVar5 = local_b8;
  for (n._2_2_ = 0; (int)(uint)n._2_2_ < keys._4_4_; n._2_2_ = n._2_2_ + 1) {
    *(undefined1 **)((long)tmp + (ulong)n._2_2_ * 8) = puVar5 + -0x10;
    __s = *(char **)((long)tmp + (ulong)n._2_2_ * 8);
    uVar4 = (ulong)n._2_2_;
    *(undefined8 *)(puVar5 + -0x18) = 0x1049b2;
    sprintf(__s,"key%d",uVar4);
    puVar5 = puVar5 + -0x10;
  }
  pbVar1 = kv_ops->cmp;
  pvVar2 = *tmp;
  pvVar3 = *tmp;
  *(undefined8 *)(puVar5 + -8) = 0x1049dc;
  local_70 = (*pbVar1)(pvVar2,pvVar3,(void *)0x0);
  if (local_70 != 0) {
    *(undefined8 *)(puVar5 + -8) = 0x104a09;
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/btree_kv_test.cc"
            ,0x330);
    kv_cmp_key_str_test::__test_pass = 0;
    if (local_70 != 0) {
      *(undefined8 *)(puVar5 + -8) = 0x104a3a;
      __assert_fail("cmp == 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/btree_kv_test.cc"
                    ,0x330,"void kv_cmp_key_str_test(btree_kv_ops *, int)");
    }
  }
  pbVar1 = local_90->cmp;
  pvVar2 = *tmp;
  pvVar3 = *tmp;
  *(undefined8 *)(puVar5 + -8) = 0x104a5b;
  local_70 = (*pbVar1)(pvVar2,pvVar3,(void *)0x0);
  if (local_70 != 0) {
    *(undefined8 *)(puVar5 + -8) = 0x104a88;
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/btree_kv_test.cc"
            ,0x332);
    kv_cmp_key_str_test::__test_pass = 0;
    if (local_70 != 0) {
      *(undefined8 *)(puVar5 + -8) = 0x104ab9;
      __assert_fail("cmp == 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/btree_kv_test.cc"
                    ,0x332,"void kv_cmp_key_str_test(btree_kv_ops *, int)");
    }
  }
  pbVar1 = kv_ops->cmp;
  pvVar2 = *tmp;
  pvVar3 = *(void **)((long)tmp + 8);
  *(undefined8 *)(puVar5 + -8) = 0x104ad8;
  local_70 = (*pbVar1)(pvVar2,pvVar3,(void *)0x0);
  if (local_70 == 0) {
    *(undefined8 *)(puVar5 + -8) = 0x104b05;
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/btree_kv_test.cc"
            ,0x336);
    kv_cmp_key_str_test::__test_pass = 0;
    if (local_70 == 0) {
      *(undefined8 *)(puVar5 + -8) = 0x104b36;
      __assert_fail("cmp != 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/btree_kv_test.cc"
                    ,0x336,"void kv_cmp_key_str_test(btree_kv_ops *, int)");
    }
  }
  pbVar1 = local_90->cmp;
  pvVar2 = *tmp;
  pvVar3 = *(void **)((long)tmp + 8);
  *(undefined8 *)(puVar5 + -8) = 0x104b58;
  local_70 = (*pbVar1)(pvVar2,pvVar3,(void *)0x0);
  if (local_70 == 0) {
    *(undefined8 *)(puVar5 + -8) = 0x104b85;
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/btree_kv_test.cc"
            ,0x338);
    kv_cmp_key_str_test::__test_pass = 0;
    if (local_70 == 0) {
      *(undefined8 *)(puVar5 + -8) = 0x104bb6;
      __assert_fail("cmp != 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/btree_kv_test.cc"
                    ,0x338,"void kv_cmp_key_str_test(btree_kv_ops *, int)");
    }
  }
  pbVar1 = kv_ops->cmp;
  pvVar2 = *tmp;
  *(undefined8 *)(puVar5 + -8) = 0x104bd1;
  local_70 = (*pbVar1)(&kv_ops2,pvVar2,(void *)0x0);
  if (local_70 == 0) {
    *(undefined8 *)(puVar5 + -8) = 0x104bfe;
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/btree_kv_test.cc"
            ,0x33c);
    kv_cmp_key_str_test::__test_pass = 0;
    if (local_70 == 0) {
      *(undefined8 *)(puVar5 + -8) = 0x104c2f;
      __assert_fail("cmp != 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/btree_kv_test.cc"
                    ,0x33c,"void kv_cmp_key_str_test(btree_kv_ops *, int)");
    }
  }
  pbVar1 = local_90->cmp;
  pvVar2 = *tmp;
  *(undefined8 *)(puVar5 + -8) = 0x104c4d;
  local_70 = (*pbVar1)(&kv_ops2,pvVar2,(void *)0x0);
  if (local_70 == 0) {
    *(undefined8 *)(puVar5 + -8) = 0x104c7a;
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/btree_kv_test.cc"
            ,0x33e);
    kv_cmp_key_str_test::__test_pass = 0;
    if (local_70 == 0) {
      *(undefined8 *)(puVar5 + -8) = 0x104cab;
      __assert_fail("cmp != 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/btree_kv_test.cc"
                    ,0x33e,"void kv_cmp_key_str_test(btree_kv_ops *, int)");
    }
  }
  pvVar2 = tmp;
  pbVar1 = kv_ops->cmp;
  *(undefined8 *)(puVar5 + -8) = 0x104cc3;
  local_70 = (*pbVar1)(pvVar2,&kv_ops2,(void *)0x0);
  if (local_70 == 0) {
    *(undefined8 *)(puVar5 + -8) = 0x104cf0;
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/btree_kv_test.cc"
            ,0x342);
    kv_cmp_key_str_test::__test_pass = 0;
    if (local_70 == 0) {
      *(undefined8 *)(puVar5 + -8) = 0x104d21;
      __assert_fail("cmp != 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/btree_kv_test.cc"
                    ,0x342,"void kv_cmp_key_str_test(btree_kv_ops *, int)");
    }
  }
  pvVar2 = tmp;
  pbVar1 = local_90->cmp;
  *(undefined8 *)(puVar5 + -8) = 0x104d3c;
  local_70 = (*pbVar1)(pvVar2,&kv_ops2,(void *)0x0);
  if (local_70 == 0) {
    *(undefined8 *)(puVar5 + -8) = 0x104d69;
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/btree_kv_test.cc"
            ,0x344);
    kv_cmp_key_str_test::__test_pass = 0;
    if (local_70 == 0) {
      *(undefined8 *)(puVar5 + -8) = 0x104d9a;
      __assert_fail("cmp != 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/btree_kv_test.cc"
                    ,0x344,"void kv_cmp_key_str_test(btree_kv_ops *, int)");
    }
  }
  pbVar1 = kv_ops->cmp;
  *(undefined8 *)(puVar5 + -8) = 0x104dae;
  local_70 = (*pbVar1)(&kv_ops2,&kv_ops2,(void *)0x0);
  if (local_70 != 0) {
    *(undefined8 *)(puVar5 + -8) = 0x104ddb;
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/btree_kv_test.cc"
            ,0x348);
    kv_cmp_key_str_test::__test_pass = 0;
    if (local_70 != 0) {
      *(undefined8 *)(puVar5 + -8) = 0x104e0c;
      __assert_fail("cmp == 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/btree_kv_test.cc"
                    ,0x348,"void kv_cmp_key_str_test(btree_kv_ops *, int)");
    }
  }
  pbVar1 = local_90->cmp;
  *(undefined8 *)(puVar5 + -8) = 0x104e23;
  local_70 = (*pbVar1)(&kv_ops2,&kv_ops2,(void *)0x0);
  if (local_70 != 0) {
    *(undefined8 *)(puVar5 + -8) = 0x104e50;
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/btree_kv_test.cc"
            ,0x34a);
    kv_cmp_key_str_test::__test_pass = 0;
    if (local_70 != 0) {
      *(undefined8 *)(puVar5 + -8) = 0x104e81;
      __assert_fail("cmp == 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/btree_kv_test.cc"
                    ,0x34a,"void kv_cmp_key_str_test(btree_kv_ops *, int)");
    }
  }
  *(undefined8 *)(puVar5 + -8) = 0x104e8f;
  free(local_90);
  *(undefined8 *)(puVar5 + -8) = 0x104e94;
  memleak_end();
  if (kv_cmp_key_str_test::__test_pass == 0) {
    *(undefined8 *)(puVar5 + -8) = 0x104edd;
    fprintf(_stderr,"%s FAILED\n","kv_cmp_key_str_test");
  }
  else {
    *(undefined8 *)(puVar5 + -8) = 0x104ebc;
    fprintf(_stderr,"%s PASSED\n","kv_cmp_key_str_test");
  }
  return;
}

Assistant:

void kv_cmp_key_str_test(btree_kv_ops *kv_ops, int i)
{

    TEST_INIT();
    memleak_start();

    idx_t idx;
    int cmp;
    int n = 4;
    char **keys = alca(char*, n);
    void *tmp;
    btree_kv_ops *kv_ops2 = NULL;

    if (i == 0){
        kv_ops2 = btree_kv_get_kb64_vb64(NULL);
    }
    if (i == 1){
        kv_ops2 =  btree_kv_get_kb32_vb64(NULL);

    }

    tmp = NULL;

    for (idx = 0; idx < n; idx ++){
        keys[idx] = alca(char, 8);
        sprintf(keys[idx], "key%d", idx);
    }

    // compare strings equal length equal values
    cmp = kv_ops->cmp(keys[0], keys[0], NULL);
    TEST_CHK( cmp == 0 );
    cmp = kv_ops2->cmp(keys[0], keys[0], NULL);
    TEST_CHK( cmp == 0 );

    // compare strings equal length diff values
    cmp = kv_ops->cmp(keys[0], keys[1], NULL);
    TEST_CHK( cmp != 0 );
    cmp = kv_ops2->cmp(keys[0], keys[1], NULL);
    TEST_CHK( cmp != 0 );

    // key1 is NULL
    cmp = kv_ops->cmp(&tmp, keys[0], NULL);
    TEST_CHK( cmp != 0 );
    cmp = kv_ops2->cmp(&tmp, keys[0], NULL);
    TEST_CHK( cmp != 0 );

    // key2 is NULL
    cmp = kv_ops->cmp(&keys[0], &tmp, NULL);
    TEST_CHK( cmp != 0 );
    cmp = kv_ops2->cmp(&keys[0], &tmp, NULL);
    TEST_CHK( cmp != 0 );

    // key1 and key2 are NULL
    cmp = kv_ops->cmp(&tmp, &tmp, NULL);
    TEST_CHK( cmp == 0 );
    cmp = kv_ops2->cmp(&tmp, &tmp, NULL);
    TEST_CHK( cmp == 0 );

    free(kv_ops2);
    memleak_end();
    TEST_RESULT("kv_cmp_key_str_test");
}